

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.c
# Opt level: O2

void av1_qm_init(CommonQuantParams *quant_params,int num_planes)

{
  qm_val_t *(*paapqVar1) [3] [19];
  int iVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  qm_val_t *(*paapqVar6) [3] [19];
  qm_val_t *(*paapqVar7) [3] [19];
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  qm_val_t *(*paapqVar11) [3] [19];
  int t;
  ulong uVar12;
  
  paapqVar1 = quant_params->giqmatrix;
  uVar10 = 0;
  paapqVar6 = paapqVar1;
  uVar8 = (ulong)(uint)num_planes;
  if (num_planes < 1) {
    uVar8 = uVar10;
  }
  for (; uVar10 != 0x10; uVar10 = uVar10 + 1) {
    paapqVar7 = paapqVar6;
    paapqVar11 = quant_params->giqmatrix + 0xf;
    for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
      piVar9 = tx_size_2d;
      iVar5 = 0;
      for (uVar12 = 0; uVar12 != 0x13; uVar12 = uVar12 + 1) {
        bVar3 = av1_get_adjusted_tx_size((TX_SIZE)uVar12);
        if (uVar10 == 0xf) {
          paapqVar11[0x10][0][uVar12] = (qm_val_t *)0x0;
          (*paapqVar11)[0][uVar12] = (qm_val_t *)0x0;
        }
        else if (uVar12 == bVar3) {
          iVar2 = *piVar9;
          paapqVar7[0x10][0][uVar12] = wt_matrix_ref[uVar10][uVar4 != 0] + iVar5;
          (*paapqVar7)[0][uVar12] = iwt_matrix_ref[uVar10][uVar4 != 0] + iVar5;
          iVar5 = iVar5 + iVar2;
        }
        else {
          paapqVar7[0x10][0][uVar12] = quant_params->gqmatrix[uVar10][uVar4][bVar3];
          (*paapqVar7)[0][uVar12] = paapqVar1[uVar10][uVar4][bVar3];
        }
        piVar9 = piVar9 + 1;
      }
      paapqVar7 = (qm_val_t *(*) [3] [19])(*paapqVar7 + 1);
      paapqVar11 = (qm_val_t *(*) [3] [19])(*paapqVar11 + 1);
    }
    paapqVar6 = paapqVar6 + 1;
  }
  return;
}

Assistant:

void av1_qm_init(CommonQuantParams *quant_params, int num_planes) {
#if CONFIG_QUANT_MATRIX || CONFIG_AV1_DECODER
  for (int q = 0; q < NUM_QM_LEVELS; ++q) {
    for (int c = 0; c < num_planes; ++c) {
      int current = 0;
      for (int t = 0; t < TX_SIZES_ALL; ++t) {
        const int size = tx_size_2d[t];
        const int qm_tx_size = av1_get_adjusted_tx_size(t);
        if (q == NUM_QM_LEVELS - 1) {
          quant_params->gqmatrix[q][c][t] = NULL;
          quant_params->giqmatrix[q][c][t] = NULL;
        } else if (t != qm_tx_size) {  // Reuse matrices for 'qm_tx_size'
          assert(t > qm_tx_size);
          quant_params->gqmatrix[q][c][t] =
              quant_params->gqmatrix[q][c][qm_tx_size];
          quant_params->giqmatrix[q][c][t] =
              quant_params->giqmatrix[q][c][qm_tx_size];
        } else {
          assert(current + size <= QM_TOTAL_SIZE);
          quant_params->gqmatrix[q][c][t] = &wt_matrix_ref[q][c >= 1][current];
          quant_params->giqmatrix[q][c][t] =
              &iwt_matrix_ref[q][c >= 1][current];
          current += size;
        }
      }
    }
  }
#else
  (void)quant_params;
  (void)num_planes;
#endif  // CONFIG_QUANT_MATRIX || CONFIG_AV1_DECODER
}